

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::getInt(Nibbler *this,int *result)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  intmax_t iVar4;
  ulong uVar5;
  ulong uVar6;
  long *local_48 [2];
  long local_38 [2];
  
  uVar2 = this->_length;
  uVar3 = this->_cursor;
  uVar5 = uVar3;
  if (uVar3 < uVar2) {
    cVar1 = (this->_input)._M_dataplus._M_p[uVar3];
    if (cVar1 == '-') {
      uVar5 = uVar3 + 1;
    }
    else {
      uVar5 = (cVar1 == '+') + uVar3;
    }
  }
  uVar6 = uVar5;
  if (uVar5 < uVar2) {
    do {
      uVar6 = uVar5;
      if (9 < (int)(this->_input)._M_dataplus._M_p[uVar5] - 0x30U) break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar2;
    } while (uVar2 != uVar5);
  }
  if (uVar3 < uVar6) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)this);
    iVar4 = strtoimax((char *)local_48[0],(char **)0x0,10);
    *result = (int)iVar4;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    this->_cursor = uVar6;
  }
  return uVar3 < uVar6;
}

Assistant:

bool Nibbler::getInt (int& result)
{
  std::string::size_type i = _cursor;

  if (i < _length)
  {
    if (_input[i] == '-')
      ++i;
    else if (_input[i] == '+')
      ++i;
  }

  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}